

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gbmmap.c
# Opt level: O0

uint mmap_get_section_size(gbspace_t sect)

{
  gbspace_t sect_local;
  uint local_4;
  
  switch(sect) {
  case rom_0:
    local_4 = 0x4000;
    break;
  case rom_n:
    local_4 = 0x4000;
    break;
  case vram:
    local_4 = 0x2000;
    break;
  case ram:
    local_4 = 0x2000;
    break;
  case wram_0:
    local_4 = 0x1000;
    break;
  case wram_n:
    local_4 = 0x1000;
    break;
  case echo:
    local_4 = 0x1e00;
    break;
  case oam:
    local_4 = 0xa0;
    break;
  case unusable:
    local_4 = 0x60;
    break;
  case io:
    local_4 = 0x80;
    break;
  case hram:
    local_4 = 0x7f;
    break;
  case ie:
    local_4 = 1;
    break;
  default:
    local_4 = 0;
  }
  return local_4;
}

Assistant:

unsigned mmap_get_section_size(gbspace_t sect)
{
    switch (sect)
    {
        case rom_0:    return ROM_BANK_SIZE;
        case rom_n:    return ROM_BANK_SIZE;
        case vram:     return VRAM_BANK_SIZE;
        case ram:      return RAM_BANK_SIZE;
        case wram_0:   return WRAM_BANK_SIZE;
        case wram_n:   return WRAM_BANK_SIZE;
        case echo:     return 0x1E00;
        case oam:      return 0x00A0;
        case unusable: return 0x0060;
        case io:       return 0x0080;
        case hram:     return 0x007F;
        case ie:       return 0x0001;
        default:       return 0;
    }
}